

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFGdbIndex.cpp
# Opt level: O0

bool __thiscall llvm::DWARFGdbIndex::parseImpl(DWARFGdbIndex *this,DataExtractor Data)

{
  uint32_t uVar1;
  reference pTVar2;
  SmallVector<unsigned_int,_0U> *this_00;
  StringRef SVar3;
  StringRef local_138;
  char *local_128;
  size_t local_120;
  uint32_t local_114;
  uint local_110;
  uint local_10c;
  uint32_t j;
  uint32_t Num;
  pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_> *Vec;
  SmallVector<unsigned_int,_0U> local_f0;
  int local_dc;
  uint local_d8;
  uint32_t local_d4;
  uint32_t i_3;
  uint32_t local_cc;
  uint32_t local_c8;
  uint32_t CuVecOffset;
  uint32_t NameOffset;
  uint32_t i_2;
  uint32_t CuVectorsTotal;
  uint32_t SymTableSize;
  uint64_t local_b0;
  uint32_t local_a8;
  uint32_t local_9c;
  uint64_t uStack_98;
  uint32_t CuIndex;
  uint64_t HighAddress;
  uint64_t LowAddress;
  uint32_t i_1;
  uint32_t AddressAreaSize;
  uint64_t local_78;
  uint64_t local_70;
  uint64_t local_68;
  uint64_t Signature;
  uint64_t TypeOffset;
  uint64_t CuOffset_1;
  uint32_t I;
  uint32_t TuListSize;
  uint64_t local_40;
  uint64_t local_38;
  uint64_t CuLength;
  uint64_t CuOffset;
  uint32_t i;
  uint32_t CuListSize;
  uint64_t Offset;
  DWARFGdbIndex *this_local;
  
  _i = 0;
  Offset = (uint64_t)this;
  uVar1 = DataExtractor::getU32(&Data,(uint64_t *)&i,(Error *)0x0);
  this->Version = uVar1;
  if (this->Version == 7) {
    uVar1 = DataExtractor::getU32(&Data,(uint64_t *)&i,(Error *)0x0);
    this->CuListOffset = uVar1;
    uVar1 = DataExtractor::getU32(&Data,(uint64_t *)&i,(Error *)0x0);
    this->TuListOffset = uVar1;
    uVar1 = DataExtractor::getU32(&Data,(uint64_t *)&i,(Error *)0x0);
    this->AddressAreaOffset = uVar1;
    uVar1 = DataExtractor::getU32(&Data,(uint64_t *)&i,(Error *)0x0);
    this->SymbolTableOffset = uVar1;
    uVar1 = DataExtractor::getU32(&Data,(uint64_t *)&i,(Error *)0x0);
    this->ConstantPoolOffset = uVar1;
    if (_i == this->CuListOffset) {
      CuOffset._4_4_ = this->TuListOffset - this->CuListOffset >> 4;
      SmallVectorImpl<llvm::DWARFGdbIndex::CompUnitEntry>::reserve
                (&(this->CuList).super_SmallVectorImpl<llvm::DWARFGdbIndex::CompUnitEntry>,
                 (ulong)CuOffset._4_4_);
      for (CuOffset._0_4_ = 0; (uint)CuOffset < CuOffset._4_4_; CuOffset._0_4_ = (uint)CuOffset + 1)
      {
        CuLength = DataExtractor::getU64(&Data,(uint64_t *)&i,(Error *)0x0);
        local_40 = DataExtractor::getU64(&Data,(uint64_t *)&i,(Error *)0x0);
        _I = CuLength;
        local_38 = local_40;
        SmallVectorTemplateBase<llvm::DWARFGdbIndex::CompUnitEntry,_true>::push_back
                  ((SmallVectorTemplateBase<llvm::DWARFGdbIndex::CompUnitEntry,_true> *)
                   &this->CuList,(CompUnitEntry *)&I);
      }
      CuOffset_1._4_4_ = (this->AddressAreaOffset - this->TuListOffset) / 0x18;
      SmallVectorImpl<llvm::DWARFGdbIndex::TypeUnitEntry>::resize
                (&(this->TuList).super_SmallVectorImpl<llvm::DWARFGdbIndex::TypeUnitEntry>,
                 (ulong)CuOffset_1._4_4_);
      for (CuOffset_1._0_4_ = 0; (uint)CuOffset_1 < CuOffset_1._4_4_;
          CuOffset_1._0_4_ = (uint)CuOffset_1 + 1) {
        TypeOffset = DataExtractor::getU64(&Data,(uint64_t *)&i,(Error *)0x0);
        Signature = DataExtractor::getU64(&Data,(uint64_t *)&i,(Error *)0x0);
        local_70 = DataExtractor::getU64(&Data,(uint64_t *)&i,(Error *)0x0);
        _i_1 = TypeOffset;
        local_78 = Signature;
        local_68 = local_70;
        pTVar2 = SmallVectorTemplateCommon<llvm::DWARFGdbIndex::TypeUnitEntry,_void>::operator[]
                           ((SmallVectorTemplateCommon<llvm::DWARFGdbIndex::TypeUnitEntry,_void> *)
                            &this->TuList,(ulong)(uint)CuOffset_1);
        pTVar2->Offset = _i_1;
        pTVar2->TypeOffset = local_78;
        pTVar2->TypeSignature = local_70;
      }
      LowAddress._4_4_ = (this->SymbolTableOffset - this->AddressAreaOffset) / 0x14;
      SmallVectorImpl<llvm::DWARFGdbIndex::AddressEntry>::reserve
                (&(this->AddressArea).super_SmallVectorImpl<llvm::DWARFGdbIndex::AddressEntry>,
                 (ulong)LowAddress._4_4_);
      for (LowAddress._0_4_ = 0; (uint)LowAddress < LowAddress._4_4_;
          LowAddress._0_4_ = (uint)LowAddress + 1) {
        HighAddress = DataExtractor::getU64(&Data,(uint64_t *)&i,(Error *)0x0);
        uStack_98 = DataExtractor::getU64(&Data,(uint64_t *)&i,(Error *)0x0);
        local_a8 = DataExtractor::getU32(&Data,(uint64_t *)&i,(Error *)0x0);
        _CuVectorsTotal = HighAddress;
        local_b0 = uStack_98;
        local_9c = local_a8;
        SmallVectorTemplateBase<llvm::DWARFGdbIndex::AddressEntry,_true>::push_back
                  ((SmallVectorTemplateBase<llvm::DWARFGdbIndex::AddressEntry,_true> *)
                   &this->AddressArea,(AddressEntry *)&CuVectorsTotal);
      }
      i_2 = this->ConstantPoolOffset - this->SymbolTableOffset >> 3;
      SmallVectorImpl<llvm::DWARFGdbIndex::SymTableEntry>::reserve
                (&(this->SymbolTable).super_SmallVectorImpl<llvm::DWARFGdbIndex::SymTableEntry>,
                 (ulong)i_2);
      NameOffset = 0;
      for (CuVecOffset = 0; CuVecOffset < i_2; CuVecOffset = CuVecOffset + 1) {
        local_c8 = DataExtractor::getU32(&Data,(uint64_t *)&i,(Error *)0x0);
        i_3 = DataExtractor::getU32(&Data,(uint64_t *)&i,(Error *)0x0);
        local_d4 = local_c8;
        local_cc = i_3;
        SmallVectorTemplateBase<llvm::DWARFGdbIndex::SymTableEntry,_true>::push_back
                  ((SmallVectorTemplateBase<llvm::DWARFGdbIndex::SymTableEntry,_true> *)
                   &this->SymbolTable,(SymTableEntry *)&stack0xffffffffffffff2c);
        if ((local_c8 != 0) || (local_cc != 0)) {
          NameOffset = NameOffset + 1;
        }
      }
      for (local_d8 = 0; local_d8 < NameOffset; local_d8 = local_d8 + 1) {
        local_dc = 0;
        SmallVector<unsigned_int,_0U>::SmallVector(&local_f0);
        SmallVectorImpl<std::pair<unsigned_int,llvm::SmallVector<unsigned_int,0u>>>::
        emplace_back<int,llvm::SmallVector<unsigned_int,0u>>
                  ((SmallVectorImpl<std::pair<unsigned_int,llvm::SmallVector<unsigned_int,0u>>> *)
                   &this->ConstantPoolVectors,&local_dc,&local_f0);
        SmallVector<unsigned_int,_0U>::~SmallVector(&local_f0);
        _j = SmallVectorTemplateCommon<std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>,_void>
             ::back((SmallVectorTemplateCommon<std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>,_void>
                     *)&this->ConstantPoolVectors);
        _j->first = (int)_i - this->ConstantPoolOffset;
        local_10c = DataExtractor::getU32(&Data,(uint64_t *)&i,(Error *)0x0);
        for (local_110 = 0; local_110 < local_10c; local_110 = local_110 + 1) {
          this_00 = &_j->second;
          local_114 = DataExtractor::getU32(&Data,(uint64_t *)&i,(Error *)0x0);
          SmallVectorTemplateBase<unsigned_int,_true>::push_back
                    ((SmallVectorTemplateBase<unsigned_int,_true> *)this_00,&local_114);
        }
      }
      local_138 = DataExtractor::getData(&Data);
      SVar3 = StringRef::drop_front(&local_138,_i);
      local_128 = SVar3.Data;
      (this->ConstantPoolStrings).Data = local_128;
      local_120 = SVar3.Length;
      (this->ConstantPoolStrings).Length = local_120;
      this->StringPoolOffset = (uint32_t)_i;
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool DWARFGdbIndex::parseImpl(DataExtractor Data) {
  uint64_t Offset = 0;

  // Only version 7 is supported at this moment.
  Version = Data.getU32(&Offset);
  if (Version != 7)
    return false;

  CuListOffset = Data.getU32(&Offset);
  TuListOffset = Data.getU32(&Offset);
  AddressAreaOffset = Data.getU32(&Offset);
  SymbolTableOffset = Data.getU32(&Offset);
  ConstantPoolOffset = Data.getU32(&Offset);

  if (Offset != CuListOffset)
    return false;

  uint32_t CuListSize = (TuListOffset - CuListOffset) / 16;
  CuList.reserve(CuListSize);
  for (uint32_t i = 0; i < CuListSize; ++i) {
    uint64_t CuOffset = Data.getU64(&Offset);
    uint64_t CuLength = Data.getU64(&Offset);
    CuList.push_back({CuOffset, CuLength});
  }

  // CU Types are no longer needed as DWARF skeleton type units never made it
  // into the standard.
  uint32_t TuListSize = (AddressAreaOffset - TuListOffset) / 24;
  TuList.resize(TuListSize);
  for (uint32_t I = 0; I < TuListSize; ++I) {
    uint64_t CuOffset = Data.getU64(&Offset);
    uint64_t TypeOffset = Data.getU64(&Offset);
    uint64_t Signature = Data.getU64(&Offset);
    TuList[I] = {CuOffset, TypeOffset, Signature};
  }

  uint32_t AddressAreaSize = (SymbolTableOffset - AddressAreaOffset) / 20;
  AddressArea.reserve(AddressAreaSize);
  for (uint32_t i = 0; i < AddressAreaSize; ++i) {
    uint64_t LowAddress = Data.getU64(&Offset);
    uint64_t HighAddress = Data.getU64(&Offset);
    uint32_t CuIndex = Data.getU32(&Offset);
    AddressArea.push_back({LowAddress, HighAddress, CuIndex});
  }

  // The symbol table. This is an open addressed hash table. The size of the
  // hash table is always a power of 2.
  // Each slot in the hash table consists of a pair of offset_type values. The
  // first value is the offset of the symbol's name in the constant pool. The
  // second value is the offset of the CU vector in the constant pool.
  // If both values are 0, then this slot in the hash table is empty. This is ok
  // because while 0 is a valid constant pool index, it cannot be a valid index
  // for both a string and a CU vector.
  uint32_t SymTableSize = (ConstantPoolOffset - SymbolTableOffset) / 8;
  SymbolTable.reserve(SymTableSize);
  uint32_t CuVectorsTotal = 0;
  for (uint32_t i = 0; i < SymTableSize; ++i) {
    uint32_t NameOffset = Data.getU32(&Offset);
    uint32_t CuVecOffset = Data.getU32(&Offset);
    SymbolTable.push_back({NameOffset, CuVecOffset});
    if (NameOffset || CuVecOffset)
      ++CuVectorsTotal;
  }

  // The constant pool. CU vectors are stored first, followed by strings.
  // The first value is the number of CU indices in the vector. Each subsequent
  // value is the index and symbol attributes of a CU in the CU list.
  for (uint32_t i = 0; i < CuVectorsTotal; ++i) {
    ConstantPoolVectors.emplace_back(0, SmallVector<uint32_t, 0>());
    auto &Vec = ConstantPoolVectors.back();
    Vec.first = Offset - ConstantPoolOffset;

    uint32_t Num = Data.getU32(&Offset);
    for (uint32_t j = 0; j < Num; ++j)
      Vec.second.push_back(Data.getU32(&Offset));
  }

  ConstantPoolStrings = Data.getData().drop_front(Offset);
  StringPoolOffset = Offset;
  return true;
}